

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  iterator *this;
  bool bVar1;
  ostream *this_00;
  iterator *it;
  iterator **__end1;
  iterator **__begin1;
  iterator *(*__range1) [2];
  iterator *src [2];
  undefined1 local_c0 [8];
  source<int> si;
  int i [5];
  source<double> sd;
  double d [3];
  float val;
  char **param_1_local;
  int param_0_local;
  
  mtrace();
  d[1] = 78.0;
  sd._step = 0;
  sd._type = 0x3ff00000;
  d[0] = -4.0;
  mpt::source<double>::source((source<double> *)(i + 4),(double *)&sd._step,3,1);
  si._step = 1;
  si._type = 2;
  i[0] = 3;
  i[1] = 4;
  i[2] = 5;
  mpt::source<int>::source((source<int> *)local_c0,&si._step,5,-2);
  __range1 = (iterator *(*) [2])(i + 4);
  src[0] = (iterator *)local_c0;
  for (__end1 = (iterator **)&__range1; __end1 != src + 1; __end1 = __end1 + 1) {
    this = *__end1;
    while( true ) {
      bVar1 = mpt::iterator::get<float>(this,(float *)((long)d + 0x14));
      if (!bVar1) break;
      this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,d[2]._4_4_);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      (*this->_vptr_iterator[1])();
    }
  }
  mpt::source<int>::~source((source<int> *)local_c0);
  mpt::source<double>::~source((source<double> *)(i + 4));
  return 0;
}

Assistant:

extern int main(int , char * const [])
{
	float val;
	mtrace();
	
	const double d[] = { 1, -4, 78 };
	mpt::source<double> sd(d, 3);
	
	const int i[] = { 1, 2, 3, 4, 5 };
	mpt::source<int> si(i, 5, -2);
	
	mpt::iterator *src[] = { &sd, &si };
	
	for (mpt::iterator *it : src) {
		while (it->get(val)) {
			std::cout << val << std::endl;
			it->advance();
		}
	}
	
	return 0;
}